

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

char * llb_buildsystem_command_get_verbose_description(llb_buildsystem_command_t *command_p)

{
  char *pcVar1;
  undefined1 local_128 [8];
  SmallString<256U> result;
  Command *command;
  llb_buildsystem_command_t *command_p_local;
  
  result.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts._248_8_ =
       command_p;
  llvm::SmallString<256U>::SmallString((SmallString<256U> *)local_128);
  (**(code **)(*(long *)result.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                        InlineElts._248_8_ + 0x20))
            (result.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts.
             _248_8_,local_128);
  pcVar1 = llvm::SmallString<256U>::c_str((SmallString<256U> *)local_128);
  pcVar1 = strdup(pcVar1);
  llvm::SmallString<256U>::~SmallString((SmallString<256U> *)local_128);
  return pcVar1;
}

Assistant:

char* llb_buildsystem_command_get_verbose_description(
    llb_buildsystem_command_t* command_p) {
  auto command = (Command*) command_p;

  SmallString<256> result;
  command->getVerboseDescription(result);
  return strdup(result.c_str());
}